

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToUTF32String(JSContext *ctx,uint32_t **pbuf,JSValue val1)

{
  int iVar1;
  uint a;
  undefined8 *in_RSI;
  JSContext *in_RDI;
  JSValue JVar2;
  int len;
  int j;
  int i;
  uint32_t *buf;
  JSString *p;
  JSValue val;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  int local_50;
  int local_4c;
  void *local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  int64_t local_30;
  undefined8 *local_28;
  JSContext *local_20;
  int local_4;
  
  JVar2.tag = in_stack_ffffffffffffff90;
  JVar2.u.float64 = in_stack_ffffffffffffff88.float64;
  local_28 = in_RSI;
  local_20 = in_RDI;
  JVar2 = JS_ToString((JSContext *)0x16f08c,JVar2);
  local_38 = JVar2.u;
  local_30 = JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    local_40.float64 = local_38.float64;
    a = (uint)*(undefined8 *)((long)local_38.ptr + 4) & 0x7fffffff;
    max_int(a,1);
    local_48 = js_malloc((JSContext *)CONCAT44(a,in_stack_ffffffffffffffa8),JVar2.tag);
    if (local_48 == (void *)0x0) {
      JS_FreeValue(local_20,JVar2);
      *local_28 = 0;
      local_4 = -1;
    }
    else {
      local_50 = 0;
      local_4c = 0;
      while (local_4c < (int)a) {
        iVar1 = string_getc((JSString *)local_40.ptr,&local_4c);
        *(int *)((long)local_48 + (long)local_50 * 4) = iVar1;
        local_50 = local_50 + 1;
      }
      JS_FreeValue(local_20,JVar2);
      *local_28 = local_48;
      local_4 = local_50;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_ToUTF32String(JSContext *ctx, uint32_t **pbuf, JSValueConst val1)
{
    JSValue val;
    JSString *p;
    uint32_t *buf;
    int i, j, len;

    val = JS_ToString(ctx, val1);
    if (JS_IsException(val))
        return -1;
    p = JS_VALUE_GET_STRING(val);
    len = p->len;
    /* UTF32 buffer length is len minus the number of correct surrogates pairs */
    buf = js_malloc(ctx, sizeof(buf[0]) * max_int(len, 1));
    if (!buf) {
        JS_FreeValue(ctx, val);
        goto fail;
    }
    for(i = j = 0; i < len;)
        buf[j++] = string_getc(p, &i);
    JS_FreeValue(ctx, val);
    *pbuf = buf;
    return j;
 fail:
    *pbuf = NULL;
    return -1;
}